

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUFA.cpp
# Opt level: O0

Pass * wasm::createGUFAPass(void)

{
  GUFAPass *this;
  
  this = (GUFAPass *)operator_new(0x38);
  anon_unknown_234::GUFAPass::GUFAPass(this,false);
  return &this->super_Pass;
}

Assistant:

Pass* createGUFAPass() { return new GUFAPass(false); }